

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O3

void __thiscall Block::DeleteRecord(Block *this,float key)

{
  pointer pRVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  
  uVar4 = (long)(this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 != 0) {
    uVar3 = (int)(uVar4 >> 3) * -0x33333333 - 1;
    if (-1 < (int)uVar3) {
      lVar7 = (ulong)uVar3 * 0x28;
      lVar5 = (ulong)uVar3 + 1;
      do {
        pRVar1 = (this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fVar8 = (float)*(int *)((long)&pRVar1->numVotes + lVar7);
        if ((fVar8 == key) && (!NAN(fVar8) && !NAN(key))) {
          std::vector<Record,_std::allocator<Record>_>::_M_erase
                    (&this->records,(Record *)((long)&(pRVar1->tconst)._M_dataplus._M_p + lVar7));
        }
        lVar7 = lVar7 + -0x28;
        lVar6 = lVar5 + -1;
        bVar2 = 0 < lVar5;
        lVar5 = lVar6;
      } while (lVar6 != 0 && bVar2);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[Block::DeleteRecord] error, no record avaliable",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return;
}

Assistant:

void Block::DeleteRecord(float key) {
    if (records.size() == 0) {
        std::cerr << "[Block::DeleteRecord] error, no record avaliable" << std::endl;
        return;
    }
    std::vector<int> deletePos;
    for (int i = records.size()-1; i >= 0; i--) {
        if (records[i].numVotes == key) {
            records.erase(records.begin() + i);
        }
    }
}